

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int __thiscall NetQuantize::fuse_requantize(NetQuantize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  int *piVar6;
  Layer *pLVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  pointer piVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  ulong local_58;
  
  ppvVar1 = &(this->super_ModelWriter).layers;
  pvVar2 = (this->super_ModelWriter).layers;
  ppLVar3 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar4 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar18 = (long)ppLVar4 - (long)ppLVar3 >> 3;
  if (ppLVar4 != ppLVar3) {
    lVar12 = 0;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar1)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->type);
      if ((iVar9 == 0) ||
         (iVar9 = std::__cxx11::string::compare
                            ((char *)&((*ppvVar1)->
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar12]->type),
         iVar9 == 0)) {
        uVar17 = lVar12 + 1;
        uVar13 = uVar17;
        if (uVar17 < uVar18) {
          iVar9 = *(((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar12]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar10 = std::__cxx11::string::compare
                               ((char *)&((*ppvVar1)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar17]->type);
            if ((((iVar10 == 0) ||
                 (iVar10 = std::__cxx11::string::compare
                                     ((char *)&((*ppvVar1)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar17]->
                                               type), iVar10 == 0)) &&
                (pLVar5 = ((*ppvVar1)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar17],
                piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar6 == 4)) &&
               (uVar13 = uVar17, *piVar6 == iVar9)) break;
            uVar17 = uVar17 + 1;
            uVar13 = uVar18;
          } while (uVar17 < uVar18);
        }
        if (uVar13 != uVar18) {
          fuse_requantize();
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != uVar18 + (uVar18 == 0));
  }
  if (ppLVar4 != ppLVar3) {
    uVar17 = 0;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar1)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17]->type);
      if ((iVar9 == 0) ||
         (iVar9 = std::__cxx11::string::compare
                            ((char *)&((*ppvVar1)->
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar17]->type),
         iVar9 == 0)) {
        uVar13 = uVar17 + 1;
        local_58 = uVar17;
        if (uVar13 < uVar18) {
          iVar9 = *(((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar17]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          uVar16 = uVar13;
          do {
            local_58 = uVar16;
            iVar10 = std::__cxx11::string::compare
                               ((char *)&((*ppvVar1)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[local_58]->type)
            ;
            if (((iVar10 == 0) &&
                (pLVar5 = ((*ppvVar1)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[local_58],
                piVar6 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar6 == 4)) && (*piVar6 == iVar9)) {
              uVar13 = local_58;
              local_58 = local_58 - 1;
              break;
            }
            uVar16 = local_58 + 1;
            uVar13 = uVar18;
          } while (local_58 + 1 < uVar18);
        }
        if (uVar13 != uVar18) {
          pLVar5 = ((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar13];
          piVar11 = (pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              piVar11) {
            local_58 = local_58 + 2;
            uVar13 = 0;
            bVar14 = true;
            do {
              uVar16 = local_58;
              if (local_58 < uVar18) {
                iVar9 = piVar11[uVar13];
                uVar15 = local_58;
                do {
                  iVar10 = std::__cxx11::string::compare
                                     ((char *)&((*ppvVar1)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar15]->
                                               type);
                  if ((((iVar10 == 0) ||
                       (iVar10 = std::__cxx11::string::compare
                                           ((char *)&((*ppvVar1)->
                                                                                                          
                                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar15]
                                                  ->type), iVar10 == 0)) &&
                      (pLVar7 = ((*ppvVar1)->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar15],
                      piVar6 = (pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                      (long)*(pointer *)
                             ((long)&(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl + 8) - (long)piVar6 == 4)) &&
                     (uVar16 = uVar15, *piVar6 == iVar9)) break;
                  uVar15 = uVar15 + 1;
                  uVar16 = uVar18;
                } while (uVar18 != uVar15);
              }
              bVar19 = false;
              bVar8 = false;
              if (uVar16 != uVar18) {
                iVar9 = std::__cxx11::string::compare
                                  ((char *)&((*ppvVar1)->
                                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar16]->type
                                  );
                if ((iVar9 != 0) ||
                   (bVar19 = *(long *)&((*ppvVar1)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar16][1].
                                       bottom_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data == 1, bVar19)) {
                  iVar9 = std::__cxx11::string::compare
                                    ((char *)&((*ppvVar1)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar16]->
                                              type);
                  bVar19 = true;
                  bVar8 = bVar14;
                  if ((iVar9 == 0) &&
                     (bVar19 = *(pointer *)
                                ((long)&((*ppvVar1)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar16][1].
                                        bottom_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl + 8) == (pointer)0x1, !bVar19)) {
                    bVar8 = false;
                  }
                }
                else {
                  bVar8 = false;
                }
              }
              if (!bVar19) break;
              uVar13 = uVar13 + 1;
              piVar11 = (pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              bVar14 = bVar8;
            } while (uVar13 < (ulong)((long)*(pointer *)
                                             ((long)&(pLVar5->tops).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl + 8) - (long)piVar11 >> 2));
            if (!bVar8) goto LAB_00146bd6;
          }
          fuse_requantize();
        }
      }
LAB_00146bd6:
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar18 + (uVar18 == 0));
  }
  return 0;
}

Assistant:

int NetQuantize::fuse_requantize()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution" && layers[j]->type != "ConvolutionDepthWise")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), layers[j]->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Split - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Split")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Split* split = (ncnn::Split*)layers[j];

        bool all_conv = true;
        for (size_t p = 0; p < split->tops.size(); p++)
        {
            int split_top_blob_index = split->tops[p];

            size_t k = j + 1;
            for (; k < layer_count; k++)
            {
                if (layers[k]->type != "Convolution" && layers[k]->type != "ConvolutionDepthWise")
                    continue;

                if (layers[k]->bottoms.size() != 1)
                    continue;

                if (layers[k]->bottoms[0] == split_top_blob_index)
                    break;
            }

            if (k == layer_count)
            {
                all_conv = false;
                break;
            }

            if (layers[k]->type == "Convolution")
            {
                ncnn::Convolution* convolution = (ncnn::Convolution*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
            if (layers[k]->type == "ConvolutionDepthWise")
            {
                ncnn::ConvolutionDepthWise* convolution = (ncnn::ConvolutionDepthWise*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
        }

        if (!all_conv)
            continue;

        j = blobs[split->tops[0]].consumer;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), split->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    return 0;
}